

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP256_SHA256.c
# Opt level: O1

uint32_t Hacl_HPKE_Curve51_CP256_SHA256_setupBaseS
                   (uint8_t *o_pkE,Hacl_Impl_HPKE_context_s o_ctx,uint8_t *skE,uint8_t *pkR,
                   uint32_t infolen,uint8_t *info)

{
  undefined8 uVar1;
  undefined1 auVar2 [24];
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 *puVar5;
  byte bVar6;
  ulong uVar7;
  uint32_t i;
  uint ikmlen;
  long lVar8;
  byte bVar9;
  uint8_t *puVar10;
  undefined1 auVar11 [16];
  uint8_t local_1e8 [13];
  uint8_t uStack_1db;
  undefined5 uStack_1da;
  undefined3 uStack_1d5;
  undefined5 uStack_1d2;
  undefined5 uStack_1cd;
  undefined3 uStack_1c8;
  uint8_t auStack_1c5 [8];
  uint8_t auStack_1bd [8];
  undefined8 uStack_1b5;
  undefined5 local_1ad;
  undefined3 uStack_1a8;
  uint8_t auStack_1a5 [8];
  uint8_t auStack_19d [8];
  undefined5 uStack_195;
  undefined3 uStack_190;
  undefined5 uStack_18d;
  uint8_t local_188 [27];
  undefined5 uStack_16d;
  undefined3 local_168;
  uint8_t auStack_165 [8];
  uint8_t auStack_15d [13];
  undefined8 uStack_150;
  uint8_t auStack_148 [8];
  uint8_t o_shared [32];
  uint8_t suite_id_kem [5];
  undefined1 auStack_108 [8];
  uint8_t zeros [32];
  uint8_t o_eae_prk [32];
  uint8_t o_kemcontext [64];
  uint8_t o_dh [32];
  undefined8 local_50;
  uint8_t suite_id [10];
  uint local_34;
  
  auStack_148[0] = '\0';
  auStack_148[1] = '\0';
  auStack_148[2] = '\0';
  auStack_148[3] = '\0';
  auStack_148[4] = '\0';
  auStack_148[5] = '\0';
  auStack_148[6] = '\0';
  auStack_148[7] = '\0';
  o_shared[0] = '\0';
  o_shared[1] = '\0';
  o_shared[2] = '\0';
  o_shared[3] = '\0';
  o_shared[4] = '\0';
  o_shared[5] = '\0';
  o_shared[6] = '\0';
  o_shared[7] = '\0';
  o_shared[8] = '\0';
  o_shared[9] = '\0';
  o_shared[10] = '\0';
  o_shared[0xb] = '\0';
  o_shared[0xc] = '\0';
  o_shared[0xd] = '\0';
  o_shared[0xe] = '\0';
  o_shared[0xf] = '\0';
  o_shared[0x10] = '\0';
  o_shared[0x11] = '\0';
  o_shared[0x12] = '\0';
  o_shared[0x13] = '\0';
  o_shared[0x14] = '\0';
  o_shared[0x15] = '\0';
  o_shared[0x16] = '\0';
  o_shared[0x17] = '\0';
  uStack_150 = 0x1d5721;
  Hacl_Curve25519_51_secret_to_public(o_pkE,skE);
  _auStack_108 = ZEXT1632(ZEXT816(0) << 0x40);
  uStack_150 = 0x1d5743;
  unique0x1000149c = _auStack_108;
  Hacl_Curve25519_51_scalarmult(o_kemcontext + 0x38,skE,pkR);
  bVar9 = 0xff;
  lVar8 = 0;
  do {
    uStack_150 = 0x1d575d;
    bVar6 = FStar_UInt8_eq_mask(o_kemcontext[lVar8 + 0x38],auStack_108[lVar8]);
    auVar4 = stack0xffffffffffffff78;
    bVar9 = bVar9 & bVar6;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  if (bVar9 != 0xff) {
    auVar2 = *(undefined1 (*) [24])o_pkE;
    uVar1 = *(undefined8 *)(o_pkE + 0x18);
    o_kemcontext._24_32_ = *(undefined1 (*) [32])pkR;
    register0x00001240 = ZEXT1632(ZEXT816(0) << 0x40);
    builtin_memcpy(o_shared + 0x18,"KEM",4);
    o_shared[0x1c] = ' ';
    builtin_memcpy(local_188,"HPKE-v1KEM",0xb);
    builtin_memcpy(local_188 + 0xb," eae_prk",8);
    local_188[0x13] = o_kemcontext[0x38];
    local_188[0x14] = o_kemcontext[0x39];
    local_188[0x15] = o_kemcontext[0x3a];
    local_188[0x16] = o_kemcontext[0x3b];
    local_188[0x17] = o_kemcontext[0x3c];
    local_188[0x18] = o_kemcontext[0x3d];
    local_188[0x19] = o_kemcontext[0x3e];
    local_188[0x1a] = o_kemcontext[0x3f];
    uStack_16d = auVar4._8_5_;
    local_168 = auVar4._13_3_;
    auStack_165[0] = o_dh[8];
    auStack_165[1] = o_dh[9];
    auStack_165[2] = o_dh[10];
    auStack_165[3] = o_dh[0xb];
    auStack_165[4] = o_dh[0xc];
    auStack_165[5] = o_dh[0xd];
    auStack_165[6] = o_dh[0xe];
    auStack_165[7] = o_dh[0xf];
    auStack_15d[0] = o_dh[0x10];
    auStack_15d[1] = o_dh[0x11];
    auStack_15d[2] = o_dh[0x12];
    auStack_15d[3] = o_dh[0x13];
    auStack_15d[4] = o_dh[0x14];
    auStack_15d[5] = o_dh[0x15];
    auStack_15d[6] = o_dh[0x16];
    auStack_15d[7] = o_dh[0x17];
    uStack_190 = 0x1d582f;
    uStack_18d = 0;
    unique0x100014bc = auVar4;
    unique0x100014dc = auStack_148;
    Hacl_HKDF_extract_sha2_256(zeros + 0x18,o_shared + 0x18,0,local_188,0x33);
    auVar4 = o_kemcontext._24_32_;
    uVar3 = o_shared._24_8_;
    local_1e8[0] = '\0';
    local_1e8[1] = ' ';
    local_1e8[2] = 'H';
    local_1e8[3] = 'P';
    local_1e8[4] = 'K';
    local_1e8[5] = 'E';
    local_1e8[6] = '-';
    local_1e8[7] = 'v';
    local_1e8[8] = 0x31;
    local_1e8[9] = o_shared[0x18];
    local_1e8[10] = o_shared[0x19];
    local_1e8[0xb] = o_shared[0x1a];
    local_1e8[0xc] = o_shared[0x1b];
    o_shared[0x1c] = SUB81(uVar3,4);
    uStack_1db = o_shared[0x1c];
    uStack_1da = 0x6572616873;
    uStack_1d5 = 0x735f64;
    uStack_1d2 = 0x7465726365;
    o_kemcontext._0_8_ = auVar2._8_8_;
    o_kemcontext._8_8_ = auVar2._16_8_;
    uStack_1cd = auVar2._0_5_;
    uStack_1c8 = auVar2._5_3_;
    auStack_1c5[0] = o_kemcontext[0];
    auStack_1c5[1] = o_kemcontext[1];
    auStack_1c5[2] = o_kemcontext[2];
    auStack_1c5[3] = o_kemcontext[3];
    auStack_1c5[4] = o_kemcontext[4];
    auStack_1c5[5] = o_kemcontext[5];
    auStack_1c5[6] = o_kemcontext[6];
    auStack_1c5[7] = o_kemcontext[7];
    auStack_1bd[0] = o_kemcontext[8];
    auStack_1bd[1] = o_kemcontext[9];
    auStack_1bd[2] = o_kemcontext[10];
    auStack_1bd[3] = o_kemcontext[0xb];
    auStack_1bd[4] = o_kemcontext[0xc];
    auStack_1bd[5] = o_kemcontext[0xd];
    auStack_1bd[6] = o_kemcontext[0xe];
    auStack_1bd[7] = o_kemcontext[0xf];
    local_1ad = o_kemcontext._24_5_;
    uStack_1a8 = o_kemcontext._29_3_;
    auStack_1a5[0] = o_kemcontext[0x20];
    auStack_1a5[1] = o_kemcontext[0x21];
    auStack_1a5[2] = o_kemcontext[0x22];
    auStack_1a5[3] = o_kemcontext[0x23];
    auStack_1a5[4] = o_kemcontext[0x24];
    auStack_1a5[5] = o_kemcontext[0x25];
    auStack_1a5[6] = o_kemcontext[0x26];
    auStack_1a5[7] = o_kemcontext[0x27];
    auStack_19d[0] = o_kemcontext[0x28];
    auStack_19d[1] = o_kemcontext[0x29];
    auStack_19d[2] = o_kemcontext[0x2a];
    auStack_19d[3] = o_kemcontext[0x2b];
    auStack_19d[4] = o_kemcontext[0x2c];
    auStack_19d[5] = o_kemcontext[0x2d];
    auStack_19d[6] = o_kemcontext[0x2e];
    auStack_19d[7] = o_kemcontext[0x2f];
    uStack_195 = auVar4._24_5_;
    uStack_190 = auVar4._29_3_;
    uStack_1b5 = uVar1;
    o_shared._24_8_ = uVar3;
    o_kemcontext._24_32_ = auVar4;
    Hacl_HKDF_expand_sha2_256(auStack_148,zeros + 0x18,0x20,local_1e8,0x5b,0x20);
    puVar5 = stack0xffffffffffffffc0;
    _auStack_108 = ZEXT1632(ZEXT816(0));
    local_50 = 0x1002000454b5048;
    suite_id[0] = '\0';
    suite_id[1] = '\x03';
    stack0xffffffffffffff18 = ZEXT1632(ZEXT816(0));
    puVar10 = stack0xffffffffffffffc0 + -0x20;
    *(undefined1 (*) [16])(stack0xffffffffffffffc0 + -0x20) = ZEXT416(0) << 0x40;
    *(undefined1 (*) [16])(puVar5 + -0x14) = ZEXT416(0) << 0x40;
    *(undefined4 *)(puVar5 + -0x20) = 0x454b5048;
    *(undefined2 *)(puVar5 + -0x1c) = 0x762d;
    puVar5[-0x1a] = 0x31;
    *(undefined8 *)(puVar5 + -0x19) = local_50;
    *(undefined2 *)(puVar5 + -0x11) = suite_id._0_2_;
    *(undefined8 *)(puVar5 + -0xf) = 0x685f64695f6b7370;
    *(undefined4 *)(puVar5 + -8) = 0x68736168;
    *(undefined8 *)(puVar5 + -0x28) = 0x1d597a;
    Hacl_HKDF_extract_sha2_256(zeros + 0x18,(uint8_t *)&local_50,0,puVar10,0x1c);
    o_shared[0x18] = '\0';
    o_shared[0x19] = '\0';
    o_shared[0x1a] = '\0';
    o_shared[0x1b] = '\0';
    o_shared[0x1c] = '\0';
    o_shared[0x1d] = '\0';
    o_shared[0x1e] = '\0';
    o_shared[0x1f] = '\0';
    ikmlen = infolen + 0x1a;
    uVar7 = (ulong)ikmlen + 0xf & 0xfffffffffffffff0;
    puVar10 = puVar10 + -uVar7;
    puVar10[-8] = 0xb6;
    puVar10[-7] = 'Y';
    puVar10[-6] = '\x1d';
    puVar10[-5] = '\0';
    puVar10[-4] = '\0';
    puVar10[-3] = '\0';
    puVar10[-2] = '\0';
    puVar10[-1] = '\0';
    memset(puVar10,0,(ulong)ikmlen);
    puVar10[0] = 'H';
    puVar10[1] = 'P';
    puVar10[2] = 'K';
    puVar10[3] = 'E';
    puVar10[4] = '-';
    puVar10[5] = 'v';
    puVar10[6] = '1';
    *(undefined8 *)(puVar10 + 7) = local_50;
    *(undefined2 *)(puVar10 + 0xf) = suite_id._0_2_;
    puVar10[0x11] = 'i';
    puVar10[0x12] = 'n';
    puVar10[0x13] = 'f';
    puVar10[0x14] = 'o';
    puVar10[0x15] = '_';
    puVar10[0x16] = 'h';
    puVar10[0x17] = 'a';
    puVar10[0x18] = 's';
    puVar5[-7 - uVar7] = 0x68;
    puVar10[-8] = '\b';
    puVar10[-7] = 'Z';
    puVar10[-6] = '\x1d';
    puVar10[-5] = '\0';
    puVar10[-4] = '\0';
    puVar10[-3] = '\0';
    puVar10[-2] = '\0';
    puVar10[-1] = '\0';
    memcpy(puVar10 + 0x1a,info,(ulong)infolen);
    puVar10[-8] = '&';
    puVar10[-7] = 'Z';
    puVar10[-6] = '\x1d';
    puVar10[-5] = '\0';
    puVar10[-4] = '\0';
    puVar10[-3] = '\0';
    puVar10[-2] = '\0';
    puVar10[-1] = '\0';
    Hacl_HKDF_extract_sha2_256(o_shared + 0x18,(uint8_t *)&local_50,0,puVar10,ikmlen);
    auVar4 = stack0xffffffffffffff18;
    uVar1 = o_eae_prk._16_8_;
    stack0xffffffffffffff78 = ZEXT832((ulong)o_shared._24_8_);
    *(undefined1 (*) [16])(puVar10 + -0x20) = ZEXT816(0) << 0x20;
    puVar10[-0x11] = '\0';
    puVar10[-0x10] = '\0';
    puVar10[-0xf] = '\0';
    puVar10[-0xe] = '\0';
    puVar10[-0xd] = '\0';
    puVar10[-0xc] = '\0';
    puVar10[-0xb] = '\0';
    puVar10[-10] = '\0';
    puVar10[-0x20] = 'H';
    puVar10[-0x1f] = 'P';
    puVar10[-0x1e] = 'K';
    puVar10[-0x1d] = 'E';
    puVar10[-0x1c] = '-';
    puVar10[-0x1b] = 'v';
    puVar10[-0x1a] = '1';
    *(undefined8 *)(puVar10 + -0x19) = local_50;
    *(undefined2 *)(puVar10 + -0x11) = suite_id._0_2_;
    puVar10[-0xf] = 's';
    puVar10[-0xe] = 'e';
    puVar10[-0xd] = 'c';
    puVar10[-0xc] = 'r';
    puVar10[-0xb] = 'e';
    puVar10[-10] = 't';
    puVar10[-0x28] = 0xb6;
    puVar10[-0x27] = 'Z';
    puVar10[-0x26] = '\x1d';
    puVar10[-0x25] = '\0';
    puVar10[-0x24] = '\0';
    puVar10[-0x23] = '\0';
    puVar10[-0x22] = '\0';
    puVar10[-0x21] = '\0';
    Hacl_HKDF_extract_sha2_256(auStack_108,auStack_148,0x20,puVar10 + -0x20,0x17);
    auVar11 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])(puVar10 + -0x80) = ZEXT1632(auVar11);
    *(undefined1 (*) [32])(puVar10 + -0x49) = ZEXT1632(auVar11);
    *(undefined1 (*) [32])(puVar10 + -0x60) = ZEXT1632(auVar11);
    puVar10[-0x80] = '\0';
    puVar10[-0x7f] = ' ';
    puVar10[-0x7e] = 'H';
    puVar10[-0x7d] = 'P';
    puVar10[-0x7c] = 'K';
    puVar10[-0x7b] = 'E';
    puVar10[-0x7a] = '-';
    puVar10[-0x79] = 'v';
    puVar10[-0x78] = '1';
    *(undefined8 *)(puVar10 + -0x77) = local_50;
    *(undefined2 *)(puVar10 + -0x6f) = suite_id._0_2_;
    puVar10[-0x6d] = 'e';
    puVar10[-0x6c] = 'x';
    puVar10[-0x6b] = 'p';
    puVar10[-0x6a] = '\0';
    o_eae_prk._24_8_ = auVar4._0_8_;
    o_kemcontext._0_8_ = auVar4._8_8_;
    o_kemcontext._8_8_ = auVar4._16_8_;
    *(undefined8 *)(puVar10 + -0x69) = o_eae_prk._24_8_;
    *(undefined8 *)(puVar10 + -0x61) = o_kemcontext._0_8_;
    *(undefined8 *)(puVar10 + -0x59) = o_kemcontext._8_8_;
    *(undefined8 *)(puVar10 + -0x51) = uVar1;
    *(undefined8 *)(puVar10 + -0x49) = o_kemcontext._56_8_;
    *(undefined8 *)(puVar10 + -0x41) = o_dh._0_8_;
    *(undefined8 *)(puVar10 + -0x39) = o_dh._8_8_;
    *(undefined8 *)(puVar10 + -0x31) = o_dh._16_8_;
    puVar10[-0x88] = '=';
    puVar10[-0x87] = '[';
    puVar10[-0x86] = '\x1d';
    puVar10[-0x85] = '\0';
    puVar10[-0x84] = '\0';
    puVar10[-0x83] = '\0';
    puVar10[-0x82] = '\0';
    puVar10[-0x81] = '\0';
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_exporter,auStack_108,0x20,puVar10 + -0x80,0x57,0x20);
    auVar11 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])(puVar10 + -0xe0) = ZEXT1632(auVar11);
    *(undefined1 (*) [32])(puVar10 + -0xa9) = ZEXT1632(auVar11);
    *(undefined1 (*) [32])(puVar10 + -0xc0) = ZEXT1632(auVar11);
    puVar10[-0xe0] = '\0';
    puVar10[-0xdf] = ' ';
    puVar10[-0xde] = 'H';
    puVar10[-0xdd] = 'P';
    puVar10[-0xdc] = 'K';
    puVar10[-0xdb] = 'E';
    puVar10[-0xda] = '-';
    puVar10[-0xd9] = 'v';
    puVar10[-0xd8] = '1';
    *(undefined8 *)(puVar10 + -0xd7) = local_50;
    *(undefined2 *)(puVar10 + -0xcf) = suite_id._0_2_;
    puVar10[-0xcd] = 'k';
    puVar10[-0xcc] = 'e';
    puVar10[-0xcb] = 'y';
    puVar10[-0xca] = '\0';
    *(undefined8 *)(puVar10 + -0xc9) = o_eae_prk._24_8_;
    *(undefined8 *)(puVar10 + -0xc1) = o_kemcontext._0_8_;
    *(undefined8 *)(puVar10 + -0xb9) = o_kemcontext._8_8_;
    *(undefined8 *)(puVar10 + -0xb1) = uVar1;
    *(undefined8 *)(puVar10 + -0xa9) = o_kemcontext._56_8_;
    *(undefined8 *)(puVar10 + -0xa1) = o_dh._0_8_;
    *(undefined8 *)(puVar10 + -0x99) = o_dh._8_8_;
    *(undefined8 *)(puVar10 + -0x91) = o_dh._16_8_;
    puVar10[-0xe8] = 0xc3;
    puVar10[-0xe7] = '[';
    puVar10[-0xe6] = '\x1d';
    puVar10[-0xe5] = '\0';
    puVar10[-0xe4] = '\0';
    puVar10[-0xe3] = '\0';
    puVar10[-0xe2] = '\0';
    puVar10[-0xe1] = '\0';
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_key,auStack_108,0x20,puVar10 + -0xe0,0x57,0x20);
    auVar11 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])(puVar10 + -0x140) = ZEXT1632(auVar11);
    *(undefined1 (*) [32])(puVar10 + -0x102) = ZEXT1632(auVar11);
    *(undefined1 (*) [32])(puVar10 + -0x120) = ZEXT1632(auVar11);
    puVar10[-0x140] = '\0';
    puVar10[-0x13f] = '\f';
    puVar10[-0x13e] = 'H';
    puVar10[-0x13d] = 'P';
    puVar10[-0x13c] = 'K';
    puVar10[-0x13b] = 'E';
    puVar10[-0x13a] = '-';
    puVar10[-0x139] = 'v';
    puVar10[-0x138] = '1';
    *(undefined8 *)(puVar10 + -0x137) = local_50;
    *(undefined2 *)(puVar10 + -0x12f) = suite_id._0_2_;
    puVar10[-0x12d] = 'b';
    puVar10[-300] = 'a';
    puVar10[-299] = 's';
    puVar10[-0x12a] = 'e';
    puVar10[-0x129] = '_';
    puVar10[-0x128] = 'n';
    puVar10[-0x127] = 'o';
    puVar10[-0x126] = 'n';
    puVar10[-0x125] = 'c';
    puVar10[-0x124] = 'e';
    puVar10[-0x123] = '\0';
    *(undefined8 *)(puVar10 + -0x122) = o_eae_prk._24_8_;
    *(undefined8 *)(puVar10 + -0x11a) = o_kemcontext._0_8_;
    *(undefined8 *)(puVar10 + -0x112) = o_kemcontext._8_8_;
    *(undefined8 *)(puVar10 + -0x10a) = uVar1;
    *(undefined8 *)(puVar10 + -0x102) = o_kemcontext._56_8_;
    *(undefined8 *)(puVar10 + -0xfa) = o_dh._0_8_;
    *(undefined8 *)(puVar10 + -0xf2) = o_dh._8_8_;
    *(undefined8 *)(puVar10 + -0xea) = o_dh._16_8_;
    puVar10[-0x148] = 'T';
    puVar10[-0x147] = '\\';
    puVar10[-0x146] = '\x1d';
    puVar10[-0x145] = '\0';
    puVar10[-0x144] = '\0';
    puVar10[-0x143] = '\0';
    puVar10[-0x142] = '\0';
    puVar10[-0x141] = '\0';
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_nonce,auStack_108,0x20,puVar10 + -0x140,0x5e,0xc);
    *o_ctx.ctx_seq = 0;
  }
  local_34 = (uint)(bVar9 == 0xff);
  return local_34;
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP256_SHA256_setupBaseS(
  uint8_t *o_pkE,
  Hacl_Impl_HPKE_context_s o_ctx,
  uint8_t *skE,
  uint8_t *pkR,
  uint32_t infolen,
  uint8_t *info
)
{
  uint8_t o_shared[32U] = { 0U };
  uint8_t *o_pkE1 = o_pkE;
  Hacl_Curve25519_51_secret_to_public(o_pkE1, skE);
  uint32_t res1 = 0U;
  uint32_t res0;
  if (res1 == 0U)
  {
    uint8_t o_dh[32U] = { 0U };
    uint8_t zeros[32U] = { 0U };
    Hacl_Curve25519_51_scalarmult(o_dh, skE, pkR);
    uint8_t res2 = 255U;
    for (uint32_t i = 0U; i < 32U; i++)
    {
      uint8_t uu____0 = FStar_UInt8_eq_mask(o_dh[i], zeros[i]);
      res2 = (uint32_t)uu____0 & (uint32_t)res2;
    }
    uint8_t z = res2;
    uint32_t res;
    if (z == 255U)
    {
      res = 1U;
    }
    else
    {
      res = 0U;
    }
    uint32_t res20 = res;
    uint8_t o_kemcontext[64U] = { 0U };
    if (res20 == 0U)
    {
      memcpy(o_kemcontext, o_pkE, 32U * sizeof (uint8_t));
      uint8_t *o_pkRm = o_kemcontext + 32U;
      uint8_t *o_pkR = o_pkRm;
      memcpy(o_pkR, pkR, 32U * sizeof (uint8_t));
      uint8_t *o_dhm = o_dh;
      uint8_t o_eae_prk[32U] = { 0U };
      uint8_t suite_id_kem[5U] = { 0U };
      uint8_t *uu____1 = suite_id_kem;
      uu____1[0U] = 0x4bU;
      uu____1[1U] = 0x45U;
      uu____1[2U] = 0x4dU;
      uint8_t *uu____2 = suite_id_kem + 3U;
      uu____2[0U] = 0U;
      uu____2[1U] = 32U;
      uint8_t *empty = suite_id_kem;
      uint8_t label_eae_prk[7U] = { 0x65U, 0x61U, 0x65U, 0x5fU, 0x70U, 0x72U, 0x6bU };
      uint32_t len0 = 51U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len0);
      uint8_t tmp0[len0];
      memset(tmp0, 0U, len0 * sizeof (uint8_t));
      uint8_t *uu____3 = tmp0;
      uu____3[0U] = 0x48U;
      uu____3[1U] = 0x50U;
      uu____3[2U] = 0x4bU;
      uu____3[3U] = 0x45U;
      uu____3[4U] = 0x2dU;
      uu____3[5U] = 0x76U;
      uu____3[6U] = 0x31U;
      memcpy(tmp0 + 7U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp0 + 12U, label_eae_prk, 7U * sizeof (uint8_t));
      memcpy(tmp0 + 19U, o_dhm, 32U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_eae_prk, empty, 0U, tmp0, len0);
      uint8_t
      label_shared_secret[13U] =
        {
          0x73U, 0x68U, 0x61U, 0x72U, 0x65U, 0x64U, 0x5fU, 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U
        };
      uint32_t len = 91U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len);
      uint8_t tmp[len];
      memset(tmp, 0U, len * sizeof (uint8_t));
      store16_be(tmp, (uint16_t)32U);
      uint8_t *uu____4 = tmp + 2U;
      uu____4[0U] = 0x48U;
      uu____4[1U] = 0x50U;
      uu____4[2U] = 0x4bU;
      uu____4[3U] = 0x45U;
      uu____4[4U] = 0x2dU;
      uu____4[5U] = 0x76U;
      uu____4[6U] = 0x31U;
      memcpy(tmp + 9U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp + 14U, label_shared_secret, 13U * sizeof (uint8_t));
      memcpy(tmp + 27U, o_kemcontext, 64U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_shared, o_eae_prk, 32U, tmp, len, 32U);
      res0 = 0U;
    }
    else
    {
      res0 = 1U;
    }
  }
  else
  {
    res0 = 1U;
  }
  if (res0 == 0U)
  {
    uint8_t o_context[65U] = { 0U };
    uint8_t o_secret[32U] = { 0U };
    uint8_t suite_id[10U] = { 0U };
    uint8_t *uu____5 = suite_id;
    uu____5[0U] = 0x48U;
    uu____5[1U] = 0x50U;
    uu____5[2U] = 0x4bU;
    uu____5[3U] = 0x45U;
    uint8_t *uu____6 = suite_id + 4U;
    uu____6[0U] = 0U;
    uu____6[1U] = 32U;
    uint8_t *uu____7 = suite_id + 6U;
    uu____7[0U] = 0U;
    uu____7[1U] = 1U;
    uint8_t *uu____8 = suite_id + 8U;
    uu____8[0U] = 0U;
    uu____8[1U] = 3U;
    uint8_t
    label_psk_id_hash[11U] =
      { 0x70U, 0x73U, 0x6bU, 0x5fU, 0x69U, 0x64U, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_psk_id_hash[32U] = { 0U };
    uint8_t *empty = suite_id;
    uint32_t len0 = 28U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len0);
    uint8_t tmp0[len0];
    memset(tmp0, 0U, len0 * sizeof (uint8_t));
    uint8_t *uu____9 = tmp0;
    uu____9[0U] = 0x48U;
    uu____9[1U] = 0x50U;
    uu____9[2U] = 0x4bU;
    uu____9[3U] = 0x45U;
    uu____9[4U] = 0x2dU;
    uu____9[5U] = 0x76U;
    uu____9[6U] = 0x31U;
    memcpy(tmp0 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp0 + 17U, label_psk_id_hash, 11U * sizeof (uint8_t));
    memcpy(tmp0 + 28U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_256(o_psk_id_hash, empty, 0U, tmp0, len0);
    uint8_t
    label_info_hash[9U] = { 0x69U, 0x6eU, 0x66U, 0x6fU, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_info_hash[32U] = { 0U };
    uint32_t len1 = 26U + infolen;
    KRML_CHECK_SIZE(sizeof (uint8_t), len1);
    uint8_t tmp1[len1];
    memset(tmp1, 0U, len1 * sizeof (uint8_t));
    uint8_t *uu____10 = tmp1;
    uu____10[0U] = 0x48U;
    uu____10[1U] = 0x50U;
    uu____10[2U] = 0x4bU;
    uu____10[3U] = 0x45U;
    uu____10[4U] = 0x2dU;
    uu____10[5U] = 0x76U;
    uu____10[6U] = 0x31U;
    memcpy(tmp1 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp1 + 17U, label_info_hash, 9U * sizeof (uint8_t));
    memcpy(tmp1 + 26U, info, infolen * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_256(o_info_hash, empty, 0U, tmp1, len1);
    o_context[0U] = 0U;
    memcpy(o_context + 1U, o_psk_id_hash, 32U * sizeof (uint8_t));
    memcpy(o_context + 33U, o_info_hash, 32U * sizeof (uint8_t));
    uint8_t label_secret[6U] = { 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U };
    uint32_t len2 = 23U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len2);
    uint8_t tmp2[len2];
    memset(tmp2, 0U, len2 * sizeof (uint8_t));
    uint8_t *uu____11 = tmp2;
    uu____11[0U] = 0x48U;
    uu____11[1U] = 0x50U;
    uu____11[2U] = 0x4bU;
    uu____11[3U] = 0x45U;
    uu____11[4U] = 0x2dU;
    uu____11[5U] = 0x76U;
    uu____11[6U] = 0x31U;
    memcpy(tmp2 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp2 + 17U, label_secret, 6U * sizeof (uint8_t));
    memcpy(tmp2 + 23U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_256(o_secret, o_shared, 32U, tmp2, len2);
    uint8_t label_exp[3U] = { 0x65U, 0x78U, 0x70U };
    uint32_t len3 = 87U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len3);
    uint8_t tmp3[len3];
    memset(tmp3, 0U, len3 * sizeof (uint8_t));
    store16_be(tmp3, (uint16_t)32U);
    uint8_t *uu____12 = tmp3 + 2U;
    uu____12[0U] = 0x48U;
    uu____12[1U] = 0x50U;
    uu____12[2U] = 0x4bU;
    uu____12[3U] = 0x45U;
    uu____12[4U] = 0x2dU;
    uu____12[5U] = 0x76U;
    uu____12[6U] = 0x31U;
    memcpy(tmp3 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp3 + 19U, label_exp, 3U * sizeof (uint8_t));
    memcpy(tmp3 + 22U, o_context, 65U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_exporter, o_secret, 32U, tmp3, len3, 32U);
    uint8_t label_key[3U] = { 0x6bU, 0x65U, 0x79U };
    uint32_t len4 = 87U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len4);
    uint8_t tmp4[len4];
    memset(tmp4, 0U, len4 * sizeof (uint8_t));
    store16_be(tmp4, (uint16_t)32U);
    uint8_t *uu____13 = tmp4 + 2U;
    uu____13[0U] = 0x48U;
    uu____13[1U] = 0x50U;
    uu____13[2U] = 0x4bU;
    uu____13[3U] = 0x45U;
    uu____13[4U] = 0x2dU;
    uu____13[5U] = 0x76U;
    uu____13[6U] = 0x31U;
    memcpy(tmp4 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp4 + 19U, label_key, 3U * sizeof (uint8_t));
    memcpy(tmp4 + 22U, o_context, 65U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_key, o_secret, 32U, tmp4, len4, 32U);
    uint8_t
    label_base_nonce[10U] =
      { 0x62U, 0x61U, 0x73U, 0x65U, 0x5fU, 0x6eU, 0x6fU, 0x6eU, 0x63U, 0x65U };
    uint32_t len = 94U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len);
    uint8_t tmp[len];
    memset(tmp, 0U, len * sizeof (uint8_t));
    store16_be(tmp, (uint16_t)12U);
    uint8_t *uu____14 = tmp + 2U;
    uu____14[0U] = 0x48U;
    uu____14[1U] = 0x50U;
    uu____14[2U] = 0x4bU;
    uu____14[3U] = 0x45U;
    uu____14[4U] = 0x2dU;
    uu____14[5U] = 0x76U;
    uu____14[6U] = 0x31U;
    memcpy(tmp + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp + 19U, label_base_nonce, 10U * sizeof (uint8_t));
    memcpy(tmp + 29U, o_context, 65U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_nonce, o_secret, 32U, tmp, len, 12U);
    o_ctx.ctx_seq[0U] = 0ULL;
    return res0;
  }
  return res0;
}